

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Glucose::Solver::minimisationWithBinaryResolution(Solver *this,vec<Glucose::Lit> *out_learnt)

{
  int iVar1;
  int iVar2;
  Lit *pLVar3;
  vec<unsigned_int> *pvVar4;
  uint *puVar5;
  Watcher *pWVar6;
  unsigned_long *puVar7;
  Lit *pLVar8;
  vec<Glucose::Lit> *in_RSI;
  long in_RDI;
  Lit p_1;
  int i_1;
  int l;
  Lit imp;
  int k;
  int nb;
  vec<Glucose::Solver::Watcher> *wbin;
  int i;
  Lit p;
  uint lbd;
  Solver *in_stack_ffffffffffffff58;
  Lit in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  bool local_7d;
  int in_stack_ffffffffffffff84;
  vec<Glucose::Lit> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff94;
  int local_58;
  int local_54;
  lbool local_49;
  int local_48;
  lbool local_41;
  int local_40;
  Lit local_3c;
  int local_38;
  int local_34;
  vec<Glucose::Solver::Watcher> *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  vec<Glucose::Lit> *local_10;
  
  local_10 = in_RSI;
  local_14 = computeLBD<Glucose::vec<Glucose::Lit>>
                       ((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  pLVar3 = vec<Glucose::Lit>::operator[](local_10,0);
  local_1c = pLVar3->x;
  local_18 = (int)operator~((Lit)local_1c);
  if (local_14 <= *(uint *)(in_RDI + 0x74)) {
    *(int *)(in_RDI + 0x430) = *(int *)(in_RDI + 0x430) + 1;
    local_20 = 1;
    while (iVar2 = local_20, iVar1 = vec<Glucose::Lit>::size(local_10), iVar2 < iVar1) {
      uVar9 = *(uint *)(in_RDI + 0x430);
      pvVar4 = (vec<unsigned_int> *)(in_RDI + 800);
      pLVar3 = vec<Glucose::Lit>::operator[](local_10,local_20);
      local_24 = pLVar3->x;
      iVar2 = var((Lit)local_24);
      puVar5 = vec<unsigned_int>::operator[](pvVar4,iVar2);
      *puVar5 = uVar9;
      local_20 = local_20 + 1;
    }
    local_30 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[]((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
                             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60.x),
                            (Lit *)in_stack_ffffffffffffff58);
    local_34 = 0;
    local_38 = 0;
    while (iVar2 = local_38, iVar1 = vec<Glucose::Solver::Watcher>::size(local_30), iVar2 < iVar1) {
      pWVar6 = vec<Glucose::Solver::Watcher>::operator[](local_30,local_38);
      local_40 = (pWVar6->blocker).x;
      local_3c.x = local_40;
      iVar2 = var((Lit)local_40);
      puVar5 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 800),iVar2);
      local_7d = false;
      if (*puVar5 == *(uint *)(in_RDI + 0x430)) {
        local_48 = local_3c.x;
        local_41 = value(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
        lbool::lbool(&local_49,'\0');
        local_7d = lbool::operator==(&local_41,local_49);
      }
      if (local_7d != false) {
        local_34 = local_34 + 1;
        iVar2 = *(int *)(in_RDI + 0x430);
        iVar1 = var(local_3c);
        puVar5 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 800),iVar1);
        *puVar5 = iVar2 - 1;
      }
      local_38 = local_38 + 1;
    }
    local_54 = vec<Glucose::Lit>::size(local_10);
    local_54 = local_54 + -1;
    if (0 < local_34) {
      puVar7 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),9);
      *puVar7 = *puVar7 + 1;
      local_58 = 1;
      while (iVar2 = local_58, iVar1 = vec<Glucose::Lit>::size(local_10), iVar2 < iVar1 - local_34)
      {
        pvVar4 = (vec<unsigned_int> *)(in_RDI + 800);
        pLVar3 = vec<Glucose::Lit>::operator[](local_10,local_58);
        iVar2 = var((Lit)pLVar3->x);
        puVar5 = vec<unsigned_int>::operator[](pvVar4,iVar2);
        if (*puVar5 != *(uint *)(in_RDI + 0x430)) {
          pLVar3 = vec<Glucose::Lit>::operator[](local_10,local_54);
          iVar2 = pLVar3->x;
          pLVar3 = vec<Glucose::Lit>::operator[](local_10,local_58);
          pLVar8 = vec<Glucose::Lit>::operator[](local_10,local_54);
          pLVar8->x = pLVar3->x;
          pLVar3 = vec<Glucose::Lit>::operator[](local_10,local_58);
          pLVar3->x = iVar2;
          local_54 = local_54 + -1;
          local_58 = local_58 + -1;
        }
        local_58 = local_58 + 1;
      }
      vec<Glucose::Lit>::shrink(local_10,local_34);
    }
  }
  return;
}

Assistant:

void Solver::minimisationWithBinaryResolution(vec <Lit> &out_learnt) {

    // Find the LBD measure
    unsigned int lbd = computeLBD(out_learnt);
    Lit p = ~out_learnt[0];

    if(lbd <= lbLBDMinimizingClause) {
        MYFLAG++;

        for(int i = 1; i < out_learnt.size(); i++) {
            permDiff[var(out_learnt[i])] = MYFLAG;
        }

        vec <Watcher> &wbin = watchesBin[p];
        int nb = 0;
        for(int k = 0; k < wbin.size(); k++) {
            Lit imp = wbin[k].blocker;
            if(permDiff[var(imp)] == MYFLAG && value(imp) == l_True) {
                nb++;
                permDiff[var(imp)] = MYFLAG - 1;
            }
        }
        int l = out_learnt.size() - 1;
        if(nb > 0) {
            stats[nbReducedClauses]++;
            for(int i = 1; i < out_learnt.size() - nb; i++) {
                if(permDiff[var(out_learnt[i])] != MYFLAG) {
                    Lit p = out_learnt[l];
                    out_learnt[l] = out_learnt[i];
                    out_learnt[i] = p;
                    l--;
                    i--;
                }
            }

            out_learnt.shrink(nb);

        }
    }
}